

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTransform.h
# Opt level: O1

ChVector<double> *
chrono::ChTransform<double>::TransformParentToLocal
          (ChVector<double> *parent,ChVector<double> *origin,ChMatrix33<double> *alignment)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  ChVector<double> *in_RDI;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  dVar7 = parent->m_data[0] - origin->m_data[0];
  dVar8 = parent->m_data[1] - origin->m_data[1];
  dVar9 = parent->m_data[2] - origin->m_data[2];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar7;
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       dVar8 * (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
  auVar1 = vfmadd231sd_fma(auVar15,auVar10,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar9;
  auVar1 = vfmadd231sd_fma(auVar1,auVar13,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       dVar8 * (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar2 = vfmadd231sd_fma(auVar16,auVar10,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar2 = vfmadd231sd_fma(auVar2,auVar13,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar7;
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       dVar8 * (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  auVar3 = vfmadd231sd_fma(auVar12,auVar11,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar9;
  auVar3 = vfmadd231sd_fma(auVar3,auVar14,auVar6);
  in_RDI->m_data[0] = auVar1._0_8_;
  in_RDI->m_data[1] = auVar2._0_8_;
  in_RDI->m_data[2] = auVar3._0_8_;
  return in_RDI;
}

Assistant:

static ChVector<Real> TransformParentToLocal(
        const ChVector<Real>& parent,  ///< point to transform, given in parent coordinates;
        const ChVector<Real>&
            origin,  ///< location of local frame with respect to parent, expressed in parent ref frame;
        const ChMatrix33<Real>&
            alignment  ///< rotation of local frame with respect to parent, expressed in parent coords.
        ) {
        Real mx = parent.x() - origin.x();
        Real my = parent.y() - origin.y();
        Real mz = parent.z() - origin.z();
        return ChVector<Real>(alignment(0, 0) * mx + alignment(1, 0) * my + alignment(2, 0) * mz,
                              alignment(0, 1) * mx + alignment(1, 1) * my + alignment(2, 1) * mz,
                              alignment(0, 2) * mx + alignment(1, 2) * my + alignment(2, 2) * mz);
    }